

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

void archive_acl_copy(archive_acl *dest,archive_acl *src)

{
  archive_acl_entry *paVar1;
  archive_acl_entry *paVar2;
  
  archive_acl_clear(dest);
  dest->mode = src->mode;
  for (paVar2 = src->acl_head; paVar2 != (archive_acl_entry *)0x0; paVar2 = paVar2->next) {
    paVar1 = acl_new_entry(dest,paVar2->type,paVar2->permset,paVar2->tag,paVar2->id);
    if (paVar1 != (archive_acl_entry *)0x0) {
      archive_mstring_copy(&paVar1->name,&paVar2->name);
    }
  }
  return;
}

Assistant:

void
archive_acl_copy(struct archive_acl *dest, struct archive_acl *src)
{
	struct archive_acl_entry *ap, *ap2;

	archive_acl_clear(dest);

	dest->mode = src->mode;
	ap = src->acl_head;
	while (ap != NULL) {
		ap2 = acl_new_entry(dest,
		    ap->type, ap->permset, ap->tag, ap->id);
		if (ap2 != NULL)
			archive_mstring_copy(&ap2->name, &ap->name);
		ap = ap->next;
	}
}